

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_get_cardinality(void **param_1)

{
  roaring64_bitmap_t *prVar1;
  uint64_t uVar2;
  long lVar3;
  
  prVar1 = roaring64_bitmap_create();
  lVar3 = 0;
  roaring64_bitmap_add(prVar1,0);
  roaring64_bitmap_add(prVar1,100000);
  roaring64_bitmap_add(prVar1,0x186a1);
  roaring64_bitmap_add(prVar1,0x186a2);
  roaring64_bitmap_add(prVar1,200000);
  uVar2 = roaring64_bitmap_get_cardinality(prVar1);
  _assert_int_equal(uVar2,5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x29a);
  roaring64_bitmap_free(prVar1);
  prVar1 = roaring64_bitmap_create();
  do {
    roaring64_bitmap_add(prVar1,0x100L << ((byte)lVar3 & 0x3f));
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x38);
  uVar2 = roaring64_bitmap_get_cardinality(prVar1);
  _assert_int_equal(uVar2,7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x2a4);
  roaring64_bitmap_free(prVar1);
  return;
}

Assistant:

DEFINE_TEST(test_get_cardinality) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();

        roaring64_bitmap_add(r, 0);
        roaring64_bitmap_add(r, 100000);
        roaring64_bitmap_add(r, 100001);
        roaring64_bitmap_add(r, 100002);
        roaring64_bitmap_add(r, 200000);

        assert_int_equal(roaring64_bitmap_get_cardinality(r), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Max depth ART.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        for (int i = 0; i < 7; ++i) {
            roaring64_bitmap_add(r, 1ULL << (i * 8 + 8));
        }
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 7);
        roaring64_bitmap_free(r);
    }
}